

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O2

void boost::to_string_helper<unsigned_long,std::allocator<unsigned_long>,std::__cxx11::string>
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,bool dump_all)

{
  char_type cVar1;
  ctype *this;
  ulong uVar2;
  size_type sVar3;
  locale alStack_38 [8];
  
  std::locale::locale(alStack_38);
  this = std::use_facet<std::ctype<char>>(alStack_38);
  std::locale::~locale(alStack_38);
  std::ctype<char>::widen((ctype<char> *)this,'0');
  cVar1 = std::ctype<char>::widen((ctype<char> *)this,'1');
  if (dump_all) {
    sVar3 = ((long)(b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) * 8;
  }
  else {
    sVar3 = b->m_num_bits;
  }
  std::__cxx11::string::assign((ulong)s,(char)sVar3);
  uVar2 = 0;
  while (sVar3 != 0) {
    if (((b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
      (s->_M_dataplus)._M_p[sVar3 - 1] = cVar1;
    }
    uVar2 = uVar2 + 1;
    sVar3 = sVar3 - 1;
  }
  return;
}

Assistant:

void to_string_helper(const dynamic_bitset<B, A> & b, stringT & s,
                      bool dump_all)
{
    typedef typename stringT::traits_type Tr;
    typedef typename stringT::value_type  Ch;

    BOOST_DYNAMIC_BITSET_CTYPE_FACET(Ch, fac, std::locale());
    const Ch zero = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0');
    const Ch one  = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

    // Note that this function may access (when
    // dump_all == true) bits beyond position size() - 1

    typedef typename dynamic_bitset<B, A>::size_type size_type;

    const size_type len = dump_all?
         dynamic_bitset<B, A>::bits_per_block * b.num_blocks():
         b.size();
    s.assign (len, zero);

    for (size_type i = 0; i < len; ++i) {
        if (b.m_unchecked_test(i))
            Tr::assign(s[len - 1 - i], one);

    }

}